

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3ul,32,1>,true>
               (int *dummy)

{
  optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3UL,_32,_1> local_38;
  
  local_38.ptr = 0;
  local_38.allocptr = 0;
  nodecpp::platform::ptrwithdatastructsdefs::
  optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3UL,_32,_1>::throwNullptrOrZombieAccess
            (&local_38);
}

Assistant:

void testPtrStructsWithZombieProperty_(int* dummy)
{
	bool OK = true;
	TestStructT optimizedPtrWithZombiePproperty;

	if constexpr( secondPtr )
		optimizedPtrWithZombiePproperty.init();
	else
		optimizedPtrWithZombiePproperty.init(nullptr);

	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, !optimizedPtrWithZombiePproperty.is_zombie() );
	try { optimizedPtrWithZombiePproperty.get_dereferencable_ptr(); OK = false; } catch ( ... ) {}
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	try { optimizedPtrWithZombiePproperty.get_ptr(); } catch ( ... ) { OK = false; }
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );

	if constexpr( secondPtr )
		optimizedPtrWithZombiePproperty.init(dummy, dummy, 17);
	else
		optimizedPtrWithZombiePproperty.init(dummy);
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, !optimizedPtrWithZombiePproperty.is_zombie() );
	try { optimizedPtrWithZombiePproperty.get_dereferencable_ptr(); } catch ( ... ) { OK = false; }
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	try { optimizedPtrWithZombiePproperty.get_ptr(); } catch ( ... ) { OK = false; }
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );

	optimizedPtrWithZombiePproperty.set_zombie();
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, optimizedPtrWithZombiePproperty.is_zombie() );
	try { optimizedPtrWithZombiePproperty.get_ptr(); OK = false; } catch ( ... ) {}
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	try { optimizedPtrWithZombiePproperty.get_dereferencable_ptr(); OK = false; } catch ( ... ) {}
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );

	if constexpr( secondPtr )
	{
		NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, optimizedPtrWithZombiePproperty.is_zombie() );
		try { optimizedPtrWithZombiePproperty.get_allocated_ptr(); OK = false; } catch ( ... ) {}
		NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
		try { optimizedPtrWithZombiePproperty.get_dereferencable_allocated_ptr(); OK = false; } catch ( ... ) {}
		NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	}
}